

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void geopolySvgFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  GeoPoly *p;
  sqlite3_str *p_00;
  char *pcVar1;
  undefined8 uVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (0 < argc) {
    p = geopolyFuncParam(context,*argv,(int *)0x0);
    if (p != (GeoPoly *)0x0) {
      p_00 = sqlite3_str_new(context->pOut->db);
      sqlite3_str_appendf(p_00,"<polyline points=");
      if (0 < p->nVertex) {
        uVar2 = 0x27;
        lVar3 = 0;
        do {
          sqlite3_str_appendf(p_00,"%c%g,%g",(double)p->a[lVar3 * 2],(double)p->a[lVar3 * 2 + 1],
                              uVar2);
          lVar3 = lVar3 + 1;
          uVar2 = 0x20;
        } while (lVar3 < p->nVertex);
      }
      sqlite3_str_appendf(p_00," %g,%g\'",(double)p->a[0],(double)p->a[1]);
      if (argc != 1) {
        uVar4 = 2;
        if (2 < argc) {
          uVar4 = (ulong)(uint)argc;
        }
        uVar5 = 1;
        do {
          pcVar1 = (char *)sqlite3ValueText(argv[uVar5],'\x01');
          if ((pcVar1 != (char *)0x0) && (*pcVar1 != '\0')) {
            sqlite3_str_appendf(p_00," %s",pcVar1);
          }
          uVar5 = uVar5 + 1;
        } while (uVar4 != uVar5);
      }
      sqlite3_str_appendf(p_00,"></polyline>");
      pcVar1 = sqlite3_str_finish(p_00);
      setResultStrOrError(context,pcVar1,-1,'\x01',sqlite3_free);
      sqlite3_free(p);
      return;
    }
  }
  return;
}

Assistant:

static void geopolySvgFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  GeoPoly *p;
  if( argc<1 ) return;
  p = geopolyFuncParam(context, argv[0], 0);
  if( p ){
    sqlite3 *db = sqlite3_context_db_handle(context);
    sqlite3_str *x = sqlite3_str_new(db);
    int i;
    char cSep = '\'';
    sqlite3_str_appendf(x, "<polyline points=");
    for(i=0; i<p->nVertex; i++){
      sqlite3_str_appendf(x, "%c%g,%g", cSep, GeoX(p,i), GeoY(p,i));
      cSep = ' ';
    }
    sqlite3_str_appendf(x, " %g,%g'", GeoX(p,0), GeoY(p,0));
    for(i=1; i<argc; i++){
      const char *z = (const char*)sqlite3_value_text(argv[i]);
      if( z && z[0] ){
        sqlite3_str_appendf(x, " %s", z);
      }
    }
    sqlite3_str_appendf(x, "></polyline>");
    sqlite3_result_text(context, sqlite3_str_finish(x), -1, sqlite3_free);
    sqlite3_free(p);
  }
}